

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O0

void rt_Translate4cols(BYTE *translation,int yl,int yh)

{
  byte bVar1;
  uint uVar2;
  int local_38;
  int count8;
  BYTE b1;
  BYTE b0;
  int c1;
  int c0;
  BYTE *source;
  int count;
  int yh_local;
  int yl_local;
  BYTE *translation_local;
  
  uVar2 = (yh - yl) + 1;
  _c1 = dc_temp + (yl << 2);
  for (local_38 = (int)uVar2 >> 1; local_38 != 0; local_38 = local_38 + -1) {
    bVar1 = translation[(int)(uint)_c1[1]];
    *_c1 = translation[(int)(uint)*_c1];
    _c1[1] = bVar1;
    bVar1 = translation[(int)(uint)_c1[3]];
    _c1[2] = translation[(int)(uint)_c1[2]];
    _c1[3] = bVar1;
    bVar1 = translation[(int)(uint)_c1[5]];
    _c1[4] = translation[(int)(uint)_c1[4]];
    _c1[5] = bVar1;
    bVar1 = translation[(int)(uint)_c1[7]];
    _c1[6] = translation[(int)(uint)_c1[6]];
    _c1[7] = bVar1;
    _c1 = _c1 + 8;
  }
  if ((uVar2 & 1) != 0) {
    bVar1 = translation[(int)(uint)_c1[1]];
    *_c1 = translation[(int)(uint)*_c1];
    _c1[1] = bVar1;
    bVar1 = translation[(int)(uint)_c1[3]];
    _c1[2] = translation[(int)(uint)_c1[2]];
    _c1[3] = bVar1;
  }
  return;
}

Assistant:

void rt_Translate4cols(const BYTE *translation, int yl, int yh)
{
	int count = yh - yl + 1;
	BYTE *source = &dc_temp[yl*4];
	int c0, c1;
	BYTE b0, b1;

	// Do 2 rows at a time.
	for (int count8 = count >> 1; count8; --count8)
	{
		c0 = source[0];			c1 = source[1];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[1] = b1;

		c0 = source[2];			c1 = source[3];
		b0 = translation[c0];	b1 = translation[c1];
		source[2] = b0;			source[3] = b1;

		c0 = source[4];			c1 = source[5];
		b0 = translation[c0];	b1 = translation[c1];
		source[4] = b0;			source[5] = b1;

		c0 = source[6];			c1 = source[7];
		b0 = translation[c0];	b1 = translation[c1];
		source[6] = b0;			source[7] = b1;

		source += 8;
	}
	// Do the final row if count was odd.
	if (count & 1)
	{
		c0 = source[0];			c1 = source[1];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[1] = b1;

		c0 = source[2];			c1 = source[3];
		b0 = translation[c0];	b1 = translation[c1];
		source[2] = b0;			source[3] = b1;
	}
}